

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::TagAliasRegistry::expandAliases
          (string *__return_storage_ptr__,TagAliasRegistry *this,string *unexpandedTestSpec)

{
  undefined8 *puVar1;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  _Base_ptr p_Var6;
  ulong *puVar7;
  ulong uVar8;
  _Rb_tree_header *p_Var9;
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  undefined8 *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  pcVar2 = (unexpandedTestSpec->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + unexpandedTestSpec->_M_string_length);
  p_Var6 = (this->m_registry)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = &(this->m_registry)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var9) {
    do {
      lVar3 = std::__cxx11::string::find((char *)__return_storage_ptr__,*(ulong *)(p_Var6 + 1),0);
      if (lVar3 != -1) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)__return_storage_ptr__);
        plVar4 = (long *)std::__cxx11::string::_M_append((char *)local_50,*(ulong *)(p_Var6 + 2));
        puVar7 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar7) {
          local_a8 = *puVar7;
          lStack_a0 = plVar4[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *puVar7;
          local_b8 = (ulong *)*plVar4;
        }
        local_b0 = plVar4[1];
        *plVar4 = (long)puVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::substr((ulong)&local_78,(ulong)__return_storage_ptr__);
        uVar8 = 0xf;
        if (local_b8 != &local_a8) {
          uVar8 = local_a8;
        }
        if (uVar8 < (ulong)(local_70 + local_b0)) {
          uVar8 = 0xf;
          if (local_78 != local_68) {
            uVar8 = local_68[0];
          }
          if (uVar8 < (ulong)(local_70 + local_b0)) goto LAB_00161ce5;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_b8);
        }
        else {
LAB_00161ce5:
          puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_78);
        }
        puVar1 = puVar5 + 2;
        if ((undefined8 *)*puVar5 == puVar1) {
          local_88 = *puVar1;
          uStack_80 = puVar5[3];
          local_98 = &local_88;
        }
        else {
          local_88 = *puVar1;
          local_98 = (undefined8 *)*puVar5;
        }
        local_90 = puVar5[1];
        *puVar5 = puVar1;
        puVar5[1] = 0;
        *(undefined1 *)puVar1 = 0;
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
        if (local_98 != &local_88) {
          operator_delete(local_98);
        }
        if (local_78 != local_68) {
          operator_delete(local_78);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TagAliasRegistry::expandAliases( std::string const& unexpandedTestSpec ) const {
        std::string expandedTestSpec = unexpandedTestSpec;
        for( std::map<std::string, TagAlias>::const_iterator it = m_registry.begin(), itEnd = m_registry.end();
                it != itEnd;
                ++it ) {
            std::size_t pos = expandedTestSpec.find( it->first );
            if( pos != std::string::npos ) {
                expandedTestSpec =  expandedTestSpec.substr( 0, pos ) +
                                    it->second.tag +
                                    expandedTestSpec.substr( pos + it->first.size() );
            }
        }
        return expandedTestSpec;
    }